

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * Omega_h::anon_unknown_41::eval_or(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  bool bVar2;
  type_info *ptVar3;
  ParserFail *this;
  allocator local_61;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  string local_40;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&bool::typeinfo);
  if (bVar1) {
    bVar1 = any_cast<bool>(lhs);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = any_cast<bool>(rhs);
    }
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<bool>()::table;
    *(bool *)&__return_storage_ptr__->storage = bVar2;
  }
  else {
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&Read<signed_char>::typeinfo);
    if (!bVar1) {
      this = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_40,"Invalid operand types to || operator",&local_61);
      ParserFail::ParserFail(this,&local_40);
      __cxa_throw(this,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_50,lhs);
    any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_60,rhs);
    lor_each((Omega_h *)&local_40,(Bytes *)&local_50,(Bytes *)&local_60);
    any::construct<Omega_h::Read<signed_char>>
              (__return_storage_ptr__,(Read<signed_char> *)&local_40);
    Write<signed_char>::~Write((Write<signed_char> *)&local_40);
    Write<signed_char>::~Write(&local_60);
    Write<signed_char>::~Write(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

any eval_or(any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool)) {
    return any_cast<bool>(lhs) || any_cast<bool>(rhs);
  } else if (lhs.type() == typeid(Bytes)) {
    return lor_each(any_cast<Bytes>(lhs), any_cast<Bytes>(rhs));
  } else {
    throw ParserFail("Invalid operand types to || operator");
  }
}